

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O2

Node * wasm::DataFlow::Node::makeZext(Node *child,Expression *origin)

{
  Node *this;
  
  this = (Node *)operator_new(0x30);
  this->type = Zext;
  this->origin = (Expression *)0x0;
  (this->values).super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->values).super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->values).super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  addValue(this,child);
  this->origin = origin;
  return this;
}

Assistant:

static Node* makeZext(Node* child, Expression* origin) {
    Node* ret = new Node(Zext);
    ret->addValue(child);
    ret->origin = origin;
    return ret;
  }